

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O1

RGB __thiscall
pbrt::MIPMap::EWA<pbrt::RGB>(MIPMap *this,int level,Point2f st,Vector2f dst0,Vector2f dst1)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  int iVar4;
  Point2i PVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar15;
  undefined1 auVar13 [16];
  undefined1 auVar12 [16];
  undefined1 extraout_var [60];
  undefined1 auVar14 [64];
  undefined8 in_XMM1_Qb;
  undefined1 auVar17 [16];
  float fVar16;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 in_XMM2_Qb;
  float fVar20;
  undefined1 auVar21 [64];
  float fVar22;
  RGB RVar23;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 extraout_var_00 [60];
  
  iVar7 = (int)(this->pyramid).nStored;
  if (level < iVar7) {
    uStack_70 = in_XMM0_Qb;
    local_78 = (undefined1  [8])st.super_Tuple2<pbrt::Point2,_float>;
    PVar5 = LevelResolution(this,level);
    auVar13 = vmovshdup_avx(_local_78);
    auVar10._8_8_ = 0;
    auVar10._0_4_ = PVar5.super_Tuple2<pbrt::Point2,_int>.x;
    auVar10._4_4_ = PVar5.super_Tuple2<pbrt::Point2,_int>.y;
    auVar10 = vcvtdq2ps_avx(auVar10);
    auVar2 = vmovshdup_avx(auVar10);
    local_98 = dst0.super_Tuple2<pbrt::Vector2,_float>.x;
    fStack_94 = dst0.super_Tuple2<pbrt::Vector2,_float>.y;
    fStack_90 = (float)in_XMM1_Qb;
    fStack_8c = (float)((ulong)in_XMM1_Qb >> 0x20);
    auVar11._0_4_ = auVar10._0_4_ * local_98;
    auVar11._4_4_ = auVar10._4_4_ * fStack_94;
    auVar11._8_4_ = auVar10._8_4_ * fStack_90;
    auVar11._12_4_ = auVar10._12_4_ * fStack_8c;
    local_68 = dst1.super_Tuple2<pbrt::Vector2,_float>.x;
    fStack_64 = dst1.super_Tuple2<pbrt::Vector2,_float>.y;
    fStack_60 = (float)in_XMM2_Qb;
    fStack_5c = (float)((ulong)in_XMM2_Qb >> 0x20);
    auVar17._0_4_ = auVar10._0_4_ * local_68;
    auVar17._4_4_ = auVar10._4_4_ * fStack_64;
    auVar17._8_4_ = auVar10._8_4_ * fStack_60;
    auVar17._12_4_ = auVar10._12_4_ * fStack_5c;
    auVar12 = vmovshdup_avx(auVar17);
    auVar9 = vmovshdup_avx(auVar11);
    auVar12 = vfmadd213ss_fma(auVar9,auVar11,ZEXT416((uint)(auVar17._0_4_ * auVar12._0_4_)));
    fVar3 = auVar12._0_4_ * -2.0;
    auVar12._0_4_ = auVar17._0_4_ * auVar17._0_4_;
    auVar12._4_4_ = auVar17._4_4_ * auVar17._4_4_;
    auVar12._8_4_ = auVar17._8_4_ * auVar17._8_4_;
    auVar12._12_4_ = auVar17._12_4_ * auVar17._12_4_;
    auVar12 = vfmadd231ps_fma(auVar12,auVar11,auVar11);
    auVar9._8_4_ = 0x3f800000;
    auVar9._0_8_ = 0x3f8000003f800000;
    auVar9._12_4_ = 0x3f800000;
    auVar9 = vaddps_avx512vl(auVar12,auVar9);
    auVar12 = vmovshdup_avx(auVar9);
    auVar12 = vfmadd213ss_fma(auVar12,auVar9,ZEXT416((uint)(fVar3 * fVar3 * -0.25)));
    fVar16 = 1.0 / auVar12._0_4_;
    fVar3 = fVar3 * fVar16;
    auVar18._0_4_ = auVar9._0_4_ * fVar16;
    auVar18._4_4_ = auVar9._4_4_ * fVar16;
    auVar18._8_4_ = auVar9._8_4_ * fVar16;
    auVar18._12_4_ = auVar9._12_4_ * fVar16;
    auVar12 = vmovshdup_avx(auVar18);
    fVar16 = auVar12._0_4_;
    auVar12 = vfnmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * fVar16 * 4.0)),ZEXT416((uint)fVar3),
                               ZEXT416((uint)fVar3));
    fVar20 = auVar12._0_4_;
    auVar19._12_4_ = 0;
    auVar19._0_12_ = ZEXT412(0);
    auVar19 = auVar19 << 0x20;
    auVar12 = vmaxss_avx(ZEXT416((uint)(auVar18._0_4_ * fVar20)),auVar19);
    if (auVar12._0_4_ < 0.0) {
      auVar21._0_4_ = sqrtf(auVar12._0_4_);
      auVar21._4_60_ = extraout_var;
      auVar19 = ZEXT816(0) << 0x40;
      auVar12 = auVar21._0_16_;
    }
    else {
      auVar12 = vsqrtss_avx(auVar12,auVar12);
    }
    auVar2 = vfmadd213ss_fma(auVar2,auVar13,SUB6416(ZEXT464(0xbf000000),0));
    auVar13 = vmaxss_avx(ZEXT416((uint)(fVar20 * fVar16)),auVar19);
    if (auVar13._0_4_ < 0.0) {
      auVar14._0_4_ = sqrtf(auVar13._0_4_);
      auVar14._4_60_ = extraout_var_00;
      auVar13 = auVar14._0_16_;
      auVar12 = ZEXT416(auVar12._0_4_);
    }
    else {
      auVar13 = vsqrtss_avx(auVar13,auVar13);
    }
    fVar20 = 1.0 / fVar20 + 1.0 / fVar20;
    auVar9 = vfnmadd213ss_fma(auVar13,ZEXT416((uint)fVar20),auVar2);
    auVar9 = vroundss_avx(auVar9,auVar9,10);
    auVar13 = vfmadd213ss_fma(auVar13,ZEXT416((uint)fVar20),auVar2);
    auVar13 = vroundss_avx(auVar13,auVar13,9);
    if ((int)auVar13._0_4_ < (int)auVar9._0_4_) {
      fVar20 = 0.0;
      auVar9 = ZEXT816(0) << 0x20;
      fVar22 = 0.0;
    }
    else {
      local_78._0_4_ = st.super_Tuple2<pbrt::Point2,_float>.x;
      auVar19 = vfmadd132ss_fma(auVar10,SUB6416(ZEXT464(0xbf000000),0),ZEXT416((uint)local_78._0_4_)
                               );
      auVar10 = vfnmadd213ss_fma(auVar12,ZEXT416((uint)fVar20),auVar19);
      auVar10 = vroundss_avx(auVar10,auVar10,10);
      auVar12 = vfmadd213ss_fma(auVar12,ZEXT416((uint)fVar20),auVar19);
      auVar12 = vroundss_avx(auVar12,auVar12,9);
      auVar21 = ZEXT864(0) << 0x20;
      fVar22 = 0.0;
      fVar20 = 0.0;
      iVar7 = (int)auVar9._0_4_;
      do {
        if ((int)auVar10._0_4_ <= (int)auVar12._0_4_) {
          local_88 = auVar2._0_4_;
          local_88 = (float)iVar7 - local_88;
          iVar6 = (int)auVar10._0_4_;
          do {
            local_98 = auVar19._0_4_;
            local_98 = (float)iVar6 - local_98;
            auVar9 = vfmadd231ss_fma(ZEXT416((uint)(local_88 * local_98 * fVar3)),
                                     ZEXT416((uint)local_98),ZEXT416((uint)(local_98 * fVar16)));
            auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)(local_88 * auVar18._0_4_)),
                                     ZEXT416((uint)local_88));
            if (auVar9._0_4_ < 1.0) {
              uVar15 = 0;
              iVar4 = (int)(auVar9._0_4_ * 128.0);
              if (0x7e < iVar4) {
                iVar4 = 0x7f;
              }
              PVar5.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
              PVar5.super_Tuple2<pbrt::Point2,_int>.x = iVar6;
              RVar23 = Texel<pbrt::RGB>(this,level,PVar5);
              fVar1 = *(float *)(weightLut + (long)iVar4 * 4);
              local_78._0_4_ = auVar21._0_4_;
              local_78._4_4_ = auVar21._4_4_;
              uStack_70._0_4_ = auVar21._8_4_;
              uStack_70._4_4_ = auVar21._12_4_;
              auVar21 = ZEXT1664(CONCAT412(uStack_70._4_4_ + fVar1 * (float)((ulong)uVar15 >> 0x20),
                                           CONCAT48((float)uStack_70 + fVar1 * (float)uVar15,
                                                    CONCAT44((float)local_78._4_4_ +
                                                             fVar1 * RVar23.g,
                                                             (float)local_78._0_4_ +
                                                             fVar1 * RVar23.r))));
              fVar20 = fVar20 + fVar1 * RVar23.b;
              fVar22 = fVar22 + fVar1;
            }
            iVar6 = iVar6 + 1;
          } while ((int)auVar12._0_4_ + 1 != iVar6);
        }
        auVar9 = auVar21._0_16_;
        bVar8 = iVar7 != (int)auVar13._0_4_;
        iVar7 = iVar7 + 1;
      } while (bVar8);
    }
    auVar13._4_4_ = fVar22;
    auVar13._0_4_ = fVar22;
    auVar13._8_4_ = fVar22;
    auVar13._12_4_ = fVar22;
    auVar10 = vdivps_avx(auVar9,auVar13);
    RVar23.b = fVar20 / fVar22;
    RVar23._0_8_ = auVar10._0_8_;
    return RVar23;
  }
  RVar23 = Texel<pbrt::RGB>(this,iVar7 + -1,(Point2i)0x0);
  return RVar23;
}

Assistant:

T MIPMap::EWA(int level, Point2f st, Vector2f dst0, Vector2f dst1) const {
    if (level >= Levels())
        return Texel<T>(Levels() - 1, {0, 0});

    // Convert EWA coordinates to appropriate scale for level
    Point2i levelRes = LevelResolution(level);
    st[0] = st[0] * levelRes[0] - 0.5f;
    st[1] = st[1] * levelRes[1] - 0.5f;
    dst0[0] *= levelRes[0];
    dst0[1] *= levelRes[1];
    dst1[0] *= levelRes[0];
    dst1[1] *= levelRes[1];

    // Compute ellipse coefficients to bound EWA filter region
    Float A = dst0[1] * dst0[1] + dst1[1] * dst1[1] + 1;
    Float B = -2 * (dst0[0] * dst0[1] + dst1[0] * dst1[1]);
    Float C = dst0[0] * dst0[0] + dst1[0] * dst1[0] + 1;
    Float invF = 1 / (A * C - B * B * 0.25f);
    A *= invF;
    B *= invF;
    C *= invF;

    // Compute the ellipse's $(s,t)$ bounding box in texture space
    Float det = -B * B + 4 * A * C;
    Float invDet = 1 / det;
    Float uSqrt = SafeSqrt(det * C), vSqrt = SafeSqrt(A * det);
    int s0 = std::ceil(st[0] - 2 * invDet * uSqrt);
    int s1 = std::floor(st[0] + 2 * invDet * uSqrt);
    int t0 = std::ceil(st[1] - 2 * invDet * vSqrt);
    int t1 = std::floor(st[1] + 2 * invDet * vSqrt);

    // Scan over ellipse bound and compute quadratic equation
    T sum{};
    Float sumWts = 0;
    for (int it = t0; it <= t1; ++it) {
        Float tt = it - st[1];
        for (int is = s0; is <= s1; ++is) {
            Float ss = is - st[0];
            // Compute squared radius and filter texel if inside ellipse
            Float r2 = A * ss * ss + B * ss * tt + C * tt * tt;
            if (r2 < 1) {
                int index = std::min<int>(r2 * WeightLUTSize, WeightLUTSize - 1);
                Float weight = weightLut[index];
                sum += weight * Texel<T>(level, {is, it});
                sumWts += weight;
            }
        }
    }
    return sum / sumWts;
}